

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.c
# Opt level: O2

uint32_t Blowfish_stream2word(uint8_t *data,uint16_t databytes,uint16_t *current)

{
  uint32_t uVar1;
  ushort uVar2;
  char cVar3;
  bool bVar4;
  
  uVar2 = *current;
  cVar3 = '\x04';
  uVar1 = 0;
  while( true ) {
    bVar4 = cVar3 == '\0';
    cVar3 = cVar3 + -1;
    if (bVar4) break;
    if (databytes <= uVar2) {
      uVar2 = 0;
    }
    uVar1 = uVar1 << 8 | (uint)data[uVar2];
    uVar2 = uVar2 + 1;
  }
  *current = uVar2;
  return uVar1;
}

Assistant:

static uint32_t
Blowfish_stream2word(const uint8_t *data, uint16_t databytes,
                     uint16_t *current)
{
    uint8_t i;
    uint16_t j;
    uint32_t temp;

    temp = 0x00000000;
    j = *current;

    for(i = 0; i < 4; i++, j++) {
        if(j >= databytes)
            j = 0;
        temp = (temp << 8) | data[j];
    }

    *current = j;
    return temp;
}